

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

ChannelGroupManifest * __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::operator<<(ChannelGroupManifest *this,string *text)

{
  _Base_ptr p_Var1;
  ArgExc *pAVar2;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (this->_insertingEntry == false) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,
               "attempt to insert too many strings into entry, or attempt to insert text before ID integer"
               ,0x5a);
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar2,asStack_198);
    __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  p_Var1 = (this->_insertionIterator)._M_node;
  if ((ulong)((long)p_Var1[1]._M_left - (long)p_Var1[1]._M_parent) <
      (ulong)((long)(this->_components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_components).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&p_Var1[1]._M_parent,text);
    p_Var1 = (this->_insertionIterator)._M_node;
    if ((long)p_Var1[1]._M_left - (long)p_Var1[1]._M_parent ==
        (long)(this->_components).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->_components).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      this->_insertingEntry = false;
    }
    return this;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Internal error: too many strings in component",0x2d);
  pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar2,asStack_198);
  __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

IDManifest::ChannelGroupManifest&
IDManifest::ChannelGroupManifest::operator<< (const std::string& text)
{
    if (!_insertingEntry)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "attempt to insert too many strings into entry, or attempt to insert text before ID integer");
    }
    if (_insertionIterator->second.size () >= _components.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Internal error: too many strings in component");
    }
    _insertionIterator->second.push_back (text);

    //
    // if the last component has been inserted, switch off insertingEntry, to mark all entries as complete
    //
    if (_insertionIterator->second.size () == _components.size ())
    {
        _insertingEntry = false;
    }
    return *this;
}